

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsprintf.c
# Opt level: O2

int vsprintf_s(char *_Dst,size_t _SizeInBytes,char *_Format,__va_list_tag *_ArgList)

{
  int iVar1;
  int *piVar2;
  ulong uVar3;
  size_t sVar4;
  __va_list_tag *in_R8;
  tSafeCRT_AssertFuncPtr p_Var5;
  ulong uVar6;
  
  if (sMBUSafeCRTAssertFunc == (tSafeCRT_AssertFuncPtr)0x0 || _Format != (char *)0x0) {
    if (_Format != (char *)0x0) {
      if (sMBUSafeCRTAssertFunc != (tSafeCRT_AssertFuncPtr)0x0 &&
          (_SizeInBytes == 0 || _Dst == (char *)0x0)) {
        (*sMBUSafeCRTAssertFunc)
                  ("\"string != NULL && sizeInBytes > 0\"","SafeCRT assert failed",
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/vsprintf.c"
                   ,0x85);
      }
      if (_SizeInBytes == 0 || _Dst == (char *)0x0) {
        piVar2 = __errno_location();
        *piVar2 = 0x16;
        if (sMBUSafeCRTAssertFunc == (tSafeCRT_AssertFuncPtr)0x0) {
          return -1;
        }
        (*sMBUSafeCRTAssertFunc)
                  ("\"string != NULL && sizeInBytes > 0\"","SafeCRT assert failed",
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/vsprintf.c"
                   ,0x85);
        return -1;
      }
      iVar1 = _vsnprintf_helper((OUTPUTFN)_Dst,(char *)_SizeInBytes,(size_t)_Format,(char *)_ArgList
                                ,in_R8);
      if (-1 < iVar1) {
        if (_SizeInBytes == 0xffffffffffffffff) {
          return iVar1;
        }
        if (_SizeInBytes == 0x7fffffff) {
          return iVar1;
        }
        uVar3 = (ulong)(iVar1 + 1);
        uVar6 = _SizeInBytes - uVar3;
        if (_SizeInBytes < uVar3 || uVar6 == 0) {
          return iVar1;
        }
        sVar4 = 8;
        if (uVar6 < 8) {
          sVar4 = uVar6;
        }
        memset(_Dst + uVar3,0xfd,sVar4);
        return iVar1;
      }
      *_Dst = '\0';
      if (((_SizeInBytes != 0xffffffffffffffff) && (_SizeInBytes != 1)) &&
         (_SizeInBytes != 0x7fffffff)) {
        sVar4 = 8;
        if (_SizeInBytes - 1 < 8) {
          sVar4 = _SizeInBytes - 1;
        }
        memset(_Dst + 1,0xfd,sVar4);
      }
      if (iVar1 != -2) {
        return iVar1;
      }
      if (sMBUSafeCRTAssertFunc == (tSafeCRT_AssertFuncPtr)0x0) {
        p_Var5 = (tSafeCRT_AssertFuncPtr)0x0;
      }
      else {
        (*sMBUSafeCRTAssertFunc)
                  ("\"(\\\"Buffer too small\\\" && 0)\"","SafeCRT assert failed",
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/vsprintf.c"
                   ,0x8f);
        p_Var5 = sMBUSafeCRTAssertFunc;
      }
      piVar2 = __errno_location();
      *piVar2 = 0x22;
      if (p_Var5 == (tSafeCRT_AssertFuncPtr)0x0) {
        return -1;
      }
      (*p_Var5)("\"(\\\"Buffer too small\\\" && 0)\"","SafeCRT assert failed",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/vsprintf.c"
                ,0x8f);
      return -1;
    }
  }
  else {
    (*sMBUSafeCRTAssertFunc)
              ("\"format != NULL\"","SafeCRT assert failed",
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/vsprintf.c"
               ,0x84);
  }
  p_Var5 = sMBUSafeCRTAssertFunc;
  piVar2 = __errno_location();
  *piVar2 = 0x16;
  if (p_Var5 != (tSafeCRT_AssertFuncPtr)0x0) {
    (*p_Var5)("\"format != NULL\"","SafeCRT assert failed",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/vsprintf.c"
              ,0x84);
  }
  return -1;
}

Assistant:

int __cdecl _vsprintf_s (
        char *string,
        size_t sizeInBytes,
        const char *format,
        va_list ap
        )
{
    int retvalue = -1;

    /* validation section */
    _VALIDATE_RETURN(format != NULL, EINVAL, -1);
    _VALIDATE_RETURN(string != NULL && sizeInBytes > 0, EINVAL, -1);

    retvalue = _vsnprintf_helper(_output_s, string, sizeInBytes, format, ap);
    if (retvalue < 0)
    {
        string[0] = 0;
        _SECURECRT__FILL_STRING(string, sizeInBytes, 1);
    }
    if (retvalue == -2)
    {
        _VALIDATE_RETURN(("Buffer too small" && 0), ERANGE, -1);
    }
    if (retvalue >= 0)
    {
        _SECURECRT__FILL_STRING(string, sizeInBytes, retvalue + 1);
    }

    return retvalue;
}